

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::EnumDescriptorProto::ByteSize(EnumDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  string *value;
  EnumOptions *value_00;
  EnumValueDescriptorProto *value_01;
  UnknownFieldSet *pUVar3;
  int local_18;
  int local_14;
  int i;
  int total_size;
  EnumDescriptorProto *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      value = name_abi_cxx11_(this);
      local_14 = internal::WireFormatLite::StringSize(value);
      local_14 = local_14 + 1;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      value_00 = options(this);
      iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumOptions>
                        (value_00);
      local_14 = iVar2 + 1 + local_14;
    }
  }
  iVar2 = value_size(this);
  local_14 = iVar2 + local_14;
  for (local_18 = 0; iVar2 = value_size(this), local_18 < iVar2; local_18 = local_18 + 1) {
    value_01 = EnumDescriptorProto::value(this,local_18);
    iVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::EnumValueDescriptorProto>(value_01);
    local_14 = iVar2 + local_14;
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar3);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int EnumDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.EnumOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  total_size += 1 * this->value_size();
  for (int i = 0; i < this->value_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->value(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}